

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabItem *pIVar1;
  ImGuiTabBar *tab_bar_00;
  ulong uVar2;
  ImU32 IVar3;
  ImGuiTabItem *in_RCX;
  ImGuiTabItem *pIVar4;
  ulong uVar5;
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *pIVar6;
  ulong uVar7;
  bool bVar8;
  
  tab_bar_00 = GImGui->CurrentTabBar;
  if (tab_bar_00 == (ImGuiTabBar *)0x0) {
    return;
  }
  if ((tab_bar_00->Flags & 0x100000) != 0) {
    return;
  }
  IVar3 = TabBarCalcTabID(tab_bar_00,label);
  if (IVar3 != 0) {
    uVar5 = (ulong)(tab_bar_00->Tabs).Size;
    bVar8 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      in_RCX = (tab_bar_00->Tabs).Data;
      bVar8 = true;
      if (in_RCX->ID != IVar3) {
        pIVar6 = in_RCX + (uVar5 - 1);
        pIVar4 = in_RCX;
        uVar2 = 1;
        do {
          uVar7 = uVar2;
          in_RCX = pIVar6;
          if (uVar5 == uVar7) break;
          in_RCX = pIVar4 + 1;
          pIVar1 = pIVar4 + 1;
          pIVar4 = in_RCX;
          uVar2 = uVar7 + 1;
        } while (pIVar1->ID != IVar3);
        bVar8 = uVar7 < uVar5;
      }
    }
    if (bVar8) goto LAB_0022cb27;
  }
  in_RCX = (ImGuiTabItem *)0x0;
LAB_0022cb27:
  if (in_RCX != (ImGuiTabItem *)0x0) {
    in_RCX->WantClose = true;
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
}